

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
* slang::splitString(string_view str,char delimiter)

{
  size_type sVar1;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  size_type nextIndex;
  size_type index;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *result;
  value_type *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  size_type in_stack_ffffffffffffff80;
  size_type in_stack_ffffffffffffff88;
  basic_string_view<char,_std::char_traits<char>_> *pbVar3;
  size_t in_stack_ffffffffffffffa0;
  
  pbVar3 = in_RDI;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            *)0x2c6bbc);
  bVar2._M_str = in_stack_ffffffffffffff70;
  bVar2._M_len = in_stack_ffffffffffffffa0;
  while (sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find
                           ((basic_string_view<char,_std::char_traits<char>_> *)bVar2._M_len,
                            (char)((ulong)pbVar3 >> 0x38),(size_type)in_RDI),
        sVar1 != 0xffffffffffffffff) {
    bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (in_RDI,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::push_back((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 *)bVar2._M_str,in_stack_ffffffffffffff68);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::substr
            (in_RDI,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::push_back((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               *)bVar2._M_str,in_stack_ffffffffffffff68);
  return (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          *)pbVar3;
}

Assistant:

std::vector<std::string_view> splitString(std::string_view str, char delimiter) {
    std::vector<std::string_view> result;
    std::string_view::size_type index = 0;
    while (true) {
        auto nextIndex = str.find(delimiter, index);
        if (nextIndex == std::string_view::npos) {
            result.push_back(str.substr(index));
            break;
        }

        result.push_back(str.substr(index, nextIndex - index));
        index = nextIndex + 1;
    }
    return result;
}